

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_map.c
# Opt level: O3

void map_destroy(map m)

{
  void *__ptr;
  ulong uVar1;
  bucket __ptr_00;
  long lVar2;
  ulong uVar3;
  
  if (m != (map)0x0) {
    __ptr_00 = m->buckets;
    if (__ptr_00 != (bucket)0x0) {
      uVar1 = m->capacity;
      if (uVar1 != 0) {
        lVar2 = 0x10;
        uVar3 = 0;
        do {
          __ptr = *(void **)((long)&m->buckets->count + lVar2);
          if (__ptr != (void *)0x0) {
            free(__ptr);
            uVar1 = m->capacity;
          }
          uVar3 = uVar3 + 1;
          lVar2 = lVar2 + 0x18;
        } while (uVar3 < uVar1);
        __ptr_00 = m->buckets;
      }
      free(__ptr_00);
    }
    free(m);
    return;
  }
  return;
}

Assistant:

void map_destroy(map m)
{
	if (m == NULL)
	{
		return;
	}

	if (m->buckets != NULL)
	{
		size_t iterator;

		for (iterator = 0; iterator < m->capacity; ++iterator)
		{
			bucket b = &m->buckets[iterator];

			if (b->pairs != NULL)
			{
				free(b->pairs);
			}
		}

		free(m->buckets);
	}

	free(m);
}